

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::InitStates(POMDPX *this)

{
  value_type pPVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  undefined4 extraout_var;
  reference ppPVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  double dVar8;
  int local_44;
  undefined1 local_40 [4];
  int s_1;
  value_type local_28;
  POMDPXState *state;
  double dStack_18;
  int s;
  double start;
  POMDPX *this_local;
  
  start = (double)this;
  if ((this->is_small_ & 1U) == 0) {
    __assert_fail("is_small_",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                  ,0x126,"void despot::POMDPX::InitStates()");
  }
  dStack_18 = get_time_second();
  iVar2 = (*(this->super_MDP)._vptr_MDP[2])();
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::resize
            (&this->states_,(long)iVar2);
  for (state._4_4_ = 0; uVar3 = (ulong)(int)state._4_4_,
      sVar4 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::size
                        (&this->states_), uVar3 < sVar4; state._4_4_ = state._4_4_ + 1) {
    iVar2 = (*(this->super_MDP)._vptr_MDP[0x19])(0,this,(ulong)state._4_4_);
    local_28 = (value_type)CONCAT44(extraout_var,iVar2);
    Parser::ComputeState((vector<int,_std::allocator<int>_> *)local_40,this->parser_,state._4_4_);
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_28->vec_id,(vector<int,_std::allocator<int>_> *)local_40);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
    pPVar1 = local_28;
    ppPVar5 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator[]
                        (&this->states_,(long)(int)state._4_4_);
    *ppPVar5 = pPVar1;
  }
  local_44 = 0;
  while( true ) {
    sVar4 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::size
                      (&this->states_);
    if (sVar4 <= (ulong)(long)local_44) {
      iVar2 = logging::level();
      if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
        plVar6 = logging::stream(3);
        poVar7 = std::operator<<(&plVar6->super_ostream,
                                 "[POMDPX::InitState] Initialized state table in ");
        dVar8 = get_time_second();
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar8 - dStack_18);
        poVar7 = std::operator<<(poVar7,"s");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      return;
    }
    ppPVar5 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator[]
                        (&this->states_,(long)local_44);
    iVar2 = (*(this->super_MDP)._vptr_MDP[9])(this,*ppPVar5);
    if (iVar2 != local_44) break;
    local_44 = local_44 + 1;
  }
  __assert_fail("GetIndex(states_[s]) == s",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x132,"void despot::POMDPX::InitStates()");
}

Assistant:

void POMDPX::InitStates() {
	assert(is_small_);

	double start = get_time_second();
	states_.resize(NumStates());

	for (int s = 0; s < states_.size(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s, 0));
		state->vec_id = parser_->ComputeState(s);
		states_[s] = state;
	}

	for (int s = 0; s < states_.size(); s++)
		assert(GetIndex(states_[s]) == s);

	logi << "[POMDPX::InitState] Initialized state table in "
		<< (get_time_second() - start) << "s" << endl;
}